

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int perform_top_color_palette_search
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int dc_mode_cost,
              int16_t *data,int16_t *top_colors,int start_n,int end_n,int step_size,
              _Bool do_header_rd_based_gating,int *last_n_searched,uint16_t *color_cache,int n_cache
              ,MB_MODE_INFO *best_mbmi,uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,
              int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,int *beat_best_rd,
              PICK_MODE_CONTEXT *ctx,uint8_t *best_blk_skip,uint8_t *tx_type_map,
              int discount_color_cost)

{
  bool bVar1;
  undefined7 in_register_00000009;
  size_t __n;
  int iVar2;
  long lVar3;
  int n;
  _Bool do_header_rd_based_breakout;
  int beat_best_palette_rd;
  undefined4 local_78;
  int local_74;
  long local_70;
  long local_68;
  MACROBLOCK *local_60;
  MB_MODE_INFO *local_58;
  int16_t *local_50;
  int16_t centroids [8];
  
  local_78 = (undefined4)CONCAT71(in_register_00000009,bsize);
  lVar3 = (long)start_n;
  local_70 = (long)step_size;
  __n = lVar3 * 2;
  local_68 = local_70 * 2;
  iVar2 = end_n;
  local_74 = dc_mode_cost;
  local_60 = x;
  local_58 = mbmi;
  local_50 = data;
  while( true ) {
    bVar1 = end_n < lVar3;
    if (0 < step_size) {
      bVar1 = lVar3 < end_n;
    }
    if (!bVar1) {
      return iVar2;
    }
    beat_best_palette_rd = 0;
    do_header_rd_based_breakout = false;
    memcpy(centroids,top_colors,__n);
    n = (int)lVar3;
    palette_rd_y(cpi,local_60,local_58,(BLOCK_SIZE)local_78,local_74,local_50,centroids,n,
                 color_cache,n_cache,do_header_rd_based_gating,best_mbmi,best_palette_color_map,
                 best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,best_blk_skip,
                 tx_type_map,&beat_best_palette_rd,&do_header_rd_based_breakout,discount_color_cost)
    ;
    *last_n_searched = n;
    if (do_header_rd_based_breakout != false) {
      *last_n_searched = end_n;
      return iVar2;
    }
    if ((beat_best_palette_rd == 0) &&
       (n = iVar2, (cpi->sf).intra_sf.prune_palette_search_level == 2)) break;
    iVar2 = n;
    lVar3 = lVar3 + local_70;
    __n = __n + local_68;
  }
  return iVar2;
}

Assistant:

static inline int perform_top_color_palette_search(
    const AV1_COMP *const cpi, MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BLOCK_SIZE bsize, int dc_mode_cost, const int16_t *data,
    int16_t *top_colors, int start_n, int end_n, int step_size,
    bool do_header_rd_based_gating, int *last_n_searched, uint16_t *color_cache,
    int n_cache, MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map,
    int64_t *best_rd, int *rate, int *rate_tokenonly, int64_t *distortion,
    uint8_t *skippable, int *beat_best_rd, PICK_MODE_CONTEXT *ctx,
    uint8_t *best_blk_skip, uint8_t *tx_type_map, int discount_color_cost) {
  int16_t centroids[PALETTE_MAX_SIZE];
  int n = start_n;
  int top_color_winner = end_n;
  /* clang-format off */
  assert(IMPLIES(step_size < 0, start_n > end_n));
  /* clang-format on */
  assert(IMPLIES(step_size > 0, start_n < end_n));
  while (!is_iter_over(n, end_n, step_size)) {
    int beat_best_palette_rd = 0;
    bool do_header_rd_based_breakout = false;
    memcpy(centroids, top_colors, n * sizeof(top_colors[0]));
    palette_rd_y(cpi, x, mbmi, bsize, dc_mode_cost, data, centroids, n,
                 color_cache, n_cache, do_header_rd_based_gating, best_mbmi,
                 best_palette_color_map, best_rd, rate, rate_tokenonly,
                 distortion, skippable, beat_best_rd, ctx, best_blk_skip,
                 tx_type_map, &beat_best_palette_rd,
                 &do_header_rd_based_breakout, discount_color_cost);
    *last_n_searched = n;
    if (do_header_rd_based_breakout) {
      // Terminate palette_size search by setting last_n_searched to end_n.
      *last_n_searched = end_n;
      break;
    }
    if (beat_best_palette_rd) {
      top_color_winner = n;
    } else if (cpi->sf.intra_sf.prune_palette_search_level == 2) {
      // At search level 2, we return immediately if we don't see an improvement
      return top_color_winner;
    }
    n += step_size;
  }
  return top_color_winner;
}